

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O1

shared_ptr<ear::PointSourcePanner> __thiscall
ear::configureFullPolarPanner(ear *this,Layout *layout)

{
  _Base_ptr *last1;
  _Rb_tree_header *p_Var1;
  _Rb_tree_const_iterator<int> last1_00;
  _Rb_tree_color _Var2;
  _Rb_tree_color _Var3;
  double dVar4;
  undefined8 uVar5;
  Index IVar6;
  void *pvVar7;
  ear *peVar8;
  bool bVar9;
  PointerType ptr;
  const_iterator cVar10;
  _Rb_tree_node_base *p_Var11;
  double *pdVar12;
  _Base_ptr p_Var13;
  Triplet *this_00;
  undefined8 *puVar14;
  internal_error *piVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var16;
  long lVar17;
  double **ppdVar18;
  _Alloc_hider _Var19;
  set<int,_std::less<int>,_std::allocator<int>_> *__range3;
  _Rb_tree_node_base *p_Var20;
  double *pdVar21;
  double **ppdVar22;
  long lVar23;
  double __tmp;
  shared_ptr<ear::PointSourcePanner> sVar24;
  vector<int,_std::allocator<int>_> realVertsVec;
  Map<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> outputChannels;
  MatrixXd positions;
  VectorXd centreDownmix;
  Vector3d centrePosition;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  positionsReal;
  Facet realVerts;
  vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  regions;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  positionsNominal;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  facets;
  MatrixXd downmix;
  set<int,_std::less<int>,_std::allocator<int>_> virtualVerts;
  string local_248;
  DenseStorage<double,__1,__1,__1,_0> local_228;
  DenseStorage<double,__1,__1,__1,_0> local_208;
  _Rb_tree_node_base *local_1e8;
  _Head_base<0UL,_ear::RegionHandler_*,_false> local_1e0;
  Matrix<double,__1,_1,_0,__1,_1> local_1d8;
  RegionHandler *local_1c0;
  Matrix<double,_3,_1,_0,_3,_1> local_1b8;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 local_18c;
  void *local_188;
  undefined8 uStack_180;
  long local_178;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  _Base_ptr local_148;
  _Base_ptr p_Stack_140;
  _Base_ptr local_138;
  _Base_ptr p_Stack_130;
  double local_128;
  pointer local_120;
  pointer local_110;
  pointer local_108;
  pointer local_f8;
  vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  local_e8;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_c8;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  local_b0;
  Matrix<double,__1,__1,_0,__1,__1> local_98;
  ear *local_80;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_78;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  local_48;
  
  local_178 = 0;
  local_188 = (void *)0x0;
  uStack_180 = 0;
  local_c8.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &local_78._M_impl.super__Rb_tree_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  getAugmentedLayout((tuple<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                      *)local_168,layout);
  local_248._M_dataplus._M_p = (pointer)&local_98;
  local_248._M_string_length = (size_type)&local_78;
  local_248.field_2._M_allocated_capacity = (size_type)&local_c8;
  local_248.field_2._8_8_ = &local_188;
  std::
  tuple<std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>&,std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>&,std::set<int,std::less<int>,std::allocator<int>>&,Eigen::Matrix<double,-1,-1,0,-1,-1>&>
  ::operator=((tuple<std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>&,std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>&,std::set<int,std::less<int>,std::allocator<int>>&,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
               *)&local_248,
              (tuple<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
               *)local_168);
  if (local_108 != (pointer)0x0) {
    operator_delete(local_108,(long)local_f8 - (long)local_108);
  }
  if (local_120 != (pointer)0x0) {
    operator_delete(local_120,(long)local_110 - (long)local_120);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             (local_158 + 8));
  free((void *)local_168._0_8_);
  Layout::name_abi_cxx11_((string *)local_168,layout);
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                   *)FACETS_abi_cxx11_,(key_type *)local_168);
  if ((Matrix<double,__1,__1,_0,__1,__1> *)local_168._0_8_ !=
      (Matrix<double,__1,__1,_0,__1,__1> *)(local_168 + 0x10)) {
    operator_delete((void *)local_168._0_8_,(ulong)(local_158._0_8_ + 1));
  }
  if (cVar10._M_node == (_Base_ptr)(FACETS_abi_cxx11_ + 8)) {
    convex_hull(&local_b0,&local_c8,1e-05);
  }
  else {
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::vector(&local_b0,
             (vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              *)(cVar10._M_node + 2));
  }
  local_e8.
  super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = this;
  if ((_Rb_tree_header *)local_78._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    last1_00._M_node = (_Base_ptr)(local_168 + 8);
    p_Var13 = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      _Var2 = p_Var13[1]._M_color;
      std::
      vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ::vector(&local_48,&local_b0);
      _adjacent_verts((Facet *)local_168,&local_48,_Var2);
      std::
      vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ::~vector(&local_48);
      bVar9 = doIntersect<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>>
                        ((_Rb_tree_const_iterator<int>)local_158._8_8_,last1_00,
                         (_Rb_tree_const_iterator<int>)
                         local_78._M_impl.super__Rb_tree_header._M_header._M_left,
                         (_Rb_tree_const_iterator<int>)&local_78._M_impl.super__Rb_tree_header);
      if (bVar9) {
        piVar15 = (internal_error *)__cxa_allocate_exception(0x10);
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_248,"invalid triangulation","");
        internal_error::internal_error(piVar15,&local_248);
        __cxa_throw(piVar15,&internal_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
                ((vector<int,std::allocator<int>> *)&local_248,
                 (_Rb_tree_const_iterator<int>)local_158._8_8_,last1_00,(allocator_type *)&local_228
                );
      local_228.m_rows = (long)(local_248._M_string_length - (long)local_248._M_dataplus._M_p) >> 2;
      local_228.m_data = (double *)local_248._M_dataplus._M_p;
      if (local_228.m_rows < 0) {
        __assert_fail("vecSize >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                      ,0xa6,
                      "Eigen::MapBase<Eigen::Map<Eigen::Matrix<int, -1, 1>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<int, -1, 1>>, Level = 0]"
                     );
      }
      local_208.m_data = (double *)0x0;
      local_208.m_rows = 0;
      local_208.m_cols = 0;
      local_1e8 = p_Var13;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                (&local_208,local_228.m_rows * 3,local_228.m_rows,3);
      pvVar7 = local_188;
      IVar6 = local_208.m_cols;
      if ((_Base_ptr)local_158._8_8_ != last1_00._M_node) {
        if (local_208.m_data != (double *)0x0 && local_208.m_cols < 0) goto LAB_0015242d;
        lVar17 = 0;
        p_Var11 = (_Rb_tree_node_base *)local_158._8_8_;
        pdVar12 = local_208.m_data;
        do {
          if (local_208.m_rows <= lVar17) goto LAB_00152340;
          if (IVar6 != 3) goto LAB_0015235f;
          _Var3 = p_Var11[1]._M_color;
          lVar23 = 0;
          pdVar21 = pdVar12;
          do {
            *pdVar21 = *(double *)((long)pvVar7 + lVar23 * 8 + (long)(int)_Var3 * 0x18);
            lVar23 = lVar23 + 1;
            pdVar21 = pdVar21 + local_208.m_rows;
          } while (lVar23 != 3);
          lVar17 = lVar17 + 1;
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
          pdVar12 = pdVar12 + 1;
        } while (p_Var11 != last1_00._M_node);
      }
      IVar6 = local_228.m_rows;
      puVar14 = (undefined8 *)((long)local_188 + (long)(int)_Var2 * 0x18);
      local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (double)*puVar14;
      local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = (double)puVar14[1];
      local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = *(double *)((long)local_188 + (long)(int)_Var2 * 0x18 + 0x10);
      local_1d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      local_1d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      if (local_228.m_rows < 0) {
        __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                      ,0x130,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      pdVar12 = local_1d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data;
      if (local_228.m_rows != 0) {
        free((void *)0x0);
        if (IVar6 == 0) {
          local_1d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               = (double *)0x0;
          pdVar12 = local_1d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
        }
        else {
          if ((ulong)IVar6 >> 0x3d != 0) {
LAB_0015244c:
            puVar14 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar14 = std::random_device::_M_fini;
            __cxa_throw(puVar14,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          pdVar12 = (double *)malloc(IVar6 * 8);
          if (IVar6 != 1 && ((ulong)pdVar12 & 0xf) != 0) {
            __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/util/Memory.h"
                          ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
          }
          if (pdVar12 == (double *)0x0) goto LAB_0015244c;
        }
      }
      local_1d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar12;
      local_1d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           IVar6;
      dVar4 = (double)local_228.m_rows;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      p_Var11 = local_1e8;
      if (local_1d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          < 0) {
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                      ,0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      if (local_1d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != 0) {
        lVar17 = 0;
        do {
          *(double *)
           ((long)local_1d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                  .m_data + lVar17) = 1.0 / dVar4;
          lVar17 = lVar17 + 8;
        } while (local_1d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows << 3 != lVar17);
      }
      boost::
      make_unique<ear::VirtualNgon,Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>&,Eigen::Matrix<double,_1,_1,0,_1,_1>&,Eigen::Matrix<double,3,1,0,3,1>&,Eigen::Matrix<double,_1,1,0,_1,1>&>
                ((boost *)&local_1c0,
                 (Map<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_228,
                 (Matrix<double,__1,__1,_0,__1,__1> *)&local_208,&local_1b8,&local_1d8);
      local_1e0._M_head_impl = local_1c0;
      local_1c0 = (RegionHandler *)0x0;
      std::
      vector<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>,std::allocator<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>>>
      ::emplace_back<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>>
                ((vector<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>,std::allocator<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>>>
                  *)&local_e8,
                 (unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_> *)
                 &local_1e0);
      if (local_1e0._M_head_impl != (RegionHandler *)0x0) {
        (*(local_1e0._M_head_impl)->_vptr_RegionHandler[2])();
      }
      local_1e0._M_head_impl = (RegionHandler *)0x0;
      if (local_1c0 != (RegionHandler *)0x0) {
        (*local_1c0->_vptr_RegionHandler[2])();
      }
      free(local_1d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          );
      free(local_208.m_data);
      if ((double **)local_248._M_dataplus._M_p != (double **)0x0) {
        operator_delete(local_248._M_dataplus._M_p,
                        local_248.field_2._M_allocated_capacity - (long)local_248._M_dataplus._M_p);
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 local_168);
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var13 != &local_78._M_impl.super__Rb_tree_header);
  }
  if (local_b0.
      super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b0.
      super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_1e8 = (_Rb_tree_node_base *)
                local_b0.
                super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    p_Var11 = (_Rb_tree_node_base *)
              local_b0.
              super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    p_Var20 = (_Rb_tree_node_base *)
              local_b0.
              super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      last1 = &p_Var20->_M_parent;
      bVar9 = doIntersect<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>>
                        (p_Var20->_M_right,(_Rb_tree_const_iterator<int>)last1,
                         (_Rb_tree_const_iterator<int>)
                         local_78._M_impl.super__Rb_tree_header._M_header._M_left,
                         (_Rb_tree_const_iterator<int>)&local_78._M_impl.super__Rb_tree_header);
      if (!bVar9) {
        if (p_Var20[1]._M_parent == (_Base_ptr)0x4) {
          std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
                    ((vector<int,std::allocator<int>> *)local_168,p_Var20->_M_right,
                     (_Rb_tree_const_iterator<int>)last1,(allocator_type *)&local_248);
          local_228.m_data = *(double **)local_168._0_8_;
          local_228.m_rows = *(Index *)(local_168._0_8_ + 8);
          local_248._M_dataplus._M_p = (pointer)0x0;
          local_248._M_string_length = 0;
          local_248.field_2._M_allocated_capacity = 0;
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                    ((DenseStorage<double,__1,__1,__1,_0> *)&local_248,0xc,4,3);
          pvVar7 = local_188;
          uVar5 = local_248.field_2._M_allocated_capacity;
          p_Var11 = p_Var20->_M_right;
          if (p_Var11 != (_Rb_tree_node_base *)last1) {
            if ((double **)local_248._M_dataplus._M_p != (double **)0x0 &&
                (long)local_248.field_2._M_allocated_capacity < 0) goto LAB_0015242d;
            lVar17 = 0;
            _Var19._M_p = local_248._M_dataplus._M_p;
            do {
              if ((long)local_248._M_string_length <= lVar17) goto LAB_00152340;
              if ((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   *)uVar5 !=
                  (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   *)0x3) goto LAB_0015235f;
              _Var2 = p_Var11[1]._M_color;
              lVar23 = 0;
              ppdVar18 = (double **)_Var19._M_p;
              do {
                *ppdVar18 = (double *)
                            *(undefined8 *)((long)pvVar7 + lVar23 * 8 + (long)(int)_Var2 * 0x18);
                lVar23 = lVar23 + 1;
                ppdVar18 = ppdVar18 + local_248._M_string_length;
              } while (lVar23 != 3);
              lVar17 = lVar17 + 1;
              p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
              _Var19._M_p = _Var19._M_p + 8;
            } while (p_Var11 != (_Rb_tree_node_base *)last1);
          }
          boost::
          make_unique<ear::QuadRegion,Eigen::Matrix<int,4,1,0,4,1>&,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                    ((boost *)&local_1b8,(Matrix<int,_4,_1,_0,_4,_1> *)&local_228,
                     (Matrix<double,__1,__1,_0,__1,__1> *)&local_248);
          local_208.m_data =
               (double *)
               local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
          local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = 0.0;
          std::
          vector<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>,std::allocator<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>>>
          ::
          emplace_back<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>>
                    ((vector<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>,std::allocator<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>>>
                      *)&local_e8,
                     (unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_> *)
                     &local_208);
          p_Var11 = local_1e8;
          if ((Triplet *)local_208.m_data != (Triplet *)0x0) {
            (*((RegionHandler *)local_208.m_data)->_vptr_RegionHandler[2])();
          }
          local_208.m_data = (double *)0x0;
          if ((Triplet *)
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] != (Triplet *)0x0) {
            (*((RegionHandler *)
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0])->_vptr_RegionHandler[2])();
          }
          free(local_248._M_dataplus._M_p);
          _Var19._M_p = (pointer)local_168._0_8_;
          uVar5 = local_158._0_8_;
        }
        else {
          if (p_Var20[1]._M_parent != (_Base_ptr)0x3) {
            piVar15 = (internal_error *)__cxa_allocate_exception(0x10);
            local_168._0_8_ = local_168 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_168,"facets with more than 4 vertices are not supported","");
            internal_error::internal_error(piVar15,(string *)local_168);
            __cxa_throw(piVar15,&internal_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
                    ((vector<int,std::allocator<int>> *)&local_248,p_Var20->_M_right,
                     (_Rb_tree_const_iterator<int>)last1,(allocator_type *)local_168);
          local_18c = *(undefined4 *)local_248._M_dataplus._M_p;
          local_190 = *(undefined4 *)(local_248._M_dataplus._M_p + 4);
          local_194 = (undefined4)*(Index *)(local_248._M_dataplus._M_p + 8);
          local_228.m_data = (double *)0x0;
          local_228.m_rows = 0;
          local_228.m_cols = 0;
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_228,9,3,3);
          pvVar7 = local_188;
          IVar6 = local_228.m_cols;
          p_Var11 = p_Var20->_M_right;
          if (p_Var11 != (_Rb_tree_node_base *)last1) {
            if ((double **)local_228.m_data != (double **)0x0 && local_228.m_cols < 0) {
LAB_0015242d:
              __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                            ,0xb2,
                            "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
                           );
            }
            lVar17 = 0;
            ppdVar18 = (double **)local_228.m_data;
            do {
              if (local_228.m_rows <= lVar17) {
LAB_00152340:
                __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                              ,0x7a,
                              "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                             );
              }
              if (IVar6 != 3) {
LAB_0015235f:
                __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow to resize.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseBase.h"
                              ,0x106,
                              "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>]"
                             );
              }
              _Var2 = p_Var11[1]._M_color;
              lVar23 = 0;
              ppdVar22 = ppdVar18;
              do {
                *ppdVar22 = (double *)
                            *(undefined8 *)((long)pvVar7 + lVar23 * 8 + (long)(int)_Var2 * 0x18);
                lVar23 = lVar23 + 1;
                ppdVar22 = ppdVar22 + local_228.m_rows;
              } while (lVar23 != 3);
              lVar17 = lVar17 + 1;
              p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
              ppdVar18 = ppdVar18 + 1;
            } while (p_Var11 != (_Rb_tree_node_base *)last1);
          }
          this_00 = (Triplet *)operator_new(0x78);
          p_Var11 = local_1e8;
          local_208.m_data = (double *)CONCAT44(local_190,local_18c);
          local_208.m_rows = CONCAT44(local_208.m_rows._4_4_,local_194);
          if ((local_228.m_rows != 3) || (local_228.m_cols != 3)) {
            __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                          ,0x115,
                          "void Eigen::PlainObjectBase<Eigen::Matrix<double, 3, 3>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 3, 3>]"
                         );
          }
          local_168._0_8_ = *local_228.m_data;
          local_168._8_8_ = local_228.m_data[1];
          local_158._0_8_ = local_228.m_data[2];
          local_158._8_8_ =
               (((Matrix<double,__1,__1,_0,__1,__1> *)(local_228.m_data + 3))->
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
          local_148 = (_Base_ptr)local_228.m_data[4];
          p_Stack_140 = (_Base_ptr)local_228.m_data[5];
          local_138 = (_Base_ptr)
                      (((Matrix<double,__1,__1,_0,__1,__1> *)(local_228.m_data + 6))->
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                      m_data;
          p_Stack_130 = (_Base_ptr)local_228.m_data[7];
          local_128 = local_228.m_data[8];
          Triplet::Triplet(this_00,(Vector3i *)&local_208,(Matrix3d *)local_168);
          local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = (double)this_00;
          std::
          vector<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>,std::allocator<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>>>
          ::
          emplace_back<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>>
                    ((vector<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>,std::allocator<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>>>
                      *)&local_e8,
                     (unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_> *)
                     &local_1b8);
          if ((Triplet *)
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] != (Triplet *)0x0) {
            (*((RegionHandler *)
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0])->_vptr_RegionHandler[2])();
          }
          free(local_228.m_data);
          _Var19._M_p = local_248._M_dataplus._M_p;
          uVar5 = local_248.field_2._M_allocated_capacity;
        }
        if ((double **)_Var19._M_p != (double **)0x0) {
          operator_delete(_Var19._M_p,uVar5 - (long)_Var19._M_p);
        }
      }
      p_Var20 = (_Rb_tree_node_base *)&p_Var20[1]._M_left;
    } while (p_Var20 != p_Var11);
  }
  local_248._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ear::PolarPointSourcePanner,std::allocator<ear::PolarPointSourcePanner>,std::vector<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>,std::allocator<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_248._M_string_length,
             (PolarPointSourcePanner **)&local_248,
             (allocator<ear::PolarPointSourcePanner> *)&local_228,&local_e8);
  local_168._0_8_ = (double *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ear::PointSourcePannerDownmix,std::allocator<ear::PointSourcePannerDownmix>,std::shared_ptr<ear::PolarPointSourcePanner>,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 8),
             (PointSourcePannerDownmix **)local_168,
             (allocator<ear::PointSourcePannerDownmix> *)&local_228,
             (shared_ptr<ear::PolarPointSourcePanner> *)&local_248,&local_98);
  peVar8 = local_80;
  uVar5 = local_168._8_8_;
  *(undefined8 *)local_80 = local_168._0_8_;
  *(undefined8 *)(local_80 + 8) = 0;
  local_168._8_8_ = 0.0;
  *(undefined8 *)(local_80 + 8) = uVar5;
  local_168._0_8_ = (double *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_string_length);
  }
  std::
  vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  ::~vector(&local_e8);
  std::
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ::~vector(&local_b0);
  free(local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_78);
  _Var16._M_pi = extraout_RDX;
  if (local_c8.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    _Var16._M_pi = extraout_RDX_00;
  }
  if (local_188 != (void *)0x0) {
    operator_delete(local_188,local_178 - (long)local_188);
    _Var16._M_pi = extraout_RDX_01;
  }
  sVar24.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var16._M_pi;
  sVar24.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)peVar8;
  return (shared_ptr<ear::PointSourcePanner>)
         sVar24.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<PointSourcePanner> configureFullPolarPanner(
      const Layout& layout) {
    std::vector<Eigen::Vector3d> positionsReal;
    std::vector<Eigen::Vector3d> positionsNominal;
    std::set<int> virtualVerts;
    Eigen::MatrixXd downmix;
    std::tie(positionsReal, positionsNominal, virtualVerts, downmix) =
        getAugmentedLayout(layout);

    // Facets of the convex hull; each set represents a facet and contains the
    // indices of its corners in positions.
    auto facets_it = FACETS.find(layout.name());
    std::vector<Facet> facets = facets_it != FACETS.end()
                                    ? facets_it->second
                                    : convex_hull(positionsNominal);

    // Turn the facets into regions for the point source panner.
    std::vector<std::unique_ptr<RegionHandler>> regions;

    // Facets adjacent to one of the virtual speakers are turned into virtual
    // ngons, with an equal power downmix from the virtual speaker to the real
    // speakers.
    for (int virtualVert : virtualVerts) {
      Facet realVerts = _adjacent_verts(facets, virtualVert);

      ear_assert(!doIntersect(realVerts.begin(), realVerts.end(),
                              virtualVerts.begin(), virtualVerts.end()),
                 "invalid triangulation");

      std::vector<int> realVertsVec(realVerts.begin(), realVerts.end());
      Eigen::Map<Eigen::VectorXi> outputChannels(realVertsVec.data(),
                                                 realVertsVec.size());
      Eigen::MatrixXd positions(outputChannels.size(), 3);
      int rowIndex = 0;
      for (int vert : realVerts) {
        positions.row(rowIndex) = positionsReal[vert];
        ++rowIndex;
      }
      Eigen::Vector3d centrePosition = positionsReal[virtualVert];
      Eigen::VectorXd centreDownmix(outputChannels.size());
      centreDownmix.fill(1.0 /
                         std::sqrt(static_cast<double>(outputChannels.size())));

      regions.push_back(boost::make_unique<VirtualNgon>(
          outputChannels, positions, centrePosition, centreDownmix));
    }
    // Facets not adjacent to virtual speakers are turned into triplets or
    // quads. In the supported layouts there are never facets with more
    // vertices.
    for (const auto& facetVerts : facets) {
      if (doIntersect(facetVerts.begin(), facetVerts.end(),
                      virtualVerts.begin(), virtualVerts.end())) {
        continue;
      }

      if (facetVerts.size() == 3) {
        std::vector<int> facetVertsVec(facetVerts.begin(), facetVerts.end());
        Eigen::Vector3i outputChannels(facetVertsVec.data());
        Eigen::MatrixXd positions(outputChannels.size(), 3);
        int rowIndex = 0;
        for (int vert : facetVerts) {
          positions.row(rowIndex) = positionsReal[vert];
          ++rowIndex;
        }
        regions.push_back(
            boost::make_unique<Triplet>(outputChannels, positions));
      } else if (facetVerts.size() == 4) {
        std::vector<int> facetVertsVec(facetVerts.begin(), facetVerts.end());
        Eigen::Vector4i outputChannels(facetVertsVec.data());
        Eigen::MatrixXd positions(outputChannels.size(), 3);
        int rowIndex = 0;
        for (int vert : facetVerts) {
          positions.row(rowIndex) = positionsReal[vert];
          ++rowIndex;
        }
        regions.push_back(
            boost::make_unique<QuadRegion>(outputChannels, positions));
      } else {
        throw internal_error(
            "facets with more than 4 vertices are not supported");
      }
    }
    return std::make_shared<PointSourcePannerDownmix>(
        std::make_shared<PolarPointSourcePanner>(std::move(regions)), downmix);
  }